

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O1

Expression *
slang::ast::ConditionalExpression::fromSyntax
          (Compilation *comp,ConditionalExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *psVar1;
  ConditionalPredicateSyntax *pCVar2;
  Pattern *this;
  ExpressionSyntax *pEVar3;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  ConditionalPatternSyntax *pCVar9;
  int *piVar10;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar11;
  Expression *pEVar12;
  Expression *this_00;
  Type *pTVar13;
  undefined4 extraout_var_00;
  ConditionalExpression *expr;
  SourceLocation location;
  Diagnostic *diag;
  Diagnostic *diag_00;
  ulong uVar14;
  bitmask<slang::ast::ASTFlags> extraFlags;
  EVP_PKEY_CTX *src;
  bitmask<slang::ast::ASTFlags> extraFlags_00;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  size_t index;
  Type *this_01;
  Type *pTVar18;
  ASTContext trueContext;
  SmallVector<slang::ast::ConditionalExpression::Condition,_2UL> conditions;
  VarMap patternVarMap;
  char *local_188;
  ASTContext local_168;
  SmallVectorBase<slang::ast::ConditionalExpression::Condition> local_128;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_f0;
  char local_d0;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *local_70;
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>_>
  local_68;
  SourceRange local_40;
  undefined4 extraout_var;
  
  local_128.data_ = (pointer)local_128.firstElement;
  local_128.len = 0;
  local_128.cap = 2;
  local_168.assertionInstance = context->assertionInstance;
  local_168.scope.ptr = (context->scope).ptr;
  local_168.lookupIndex = context->lookupIndex;
  local_168._12_4_ = *(undefined4 *)&context->field_0xc;
  local_168.flags.m_bits = (context->flags).m_bits;
  local_168.instanceOrProc = context->instanceOrProc;
  local_168.firstTempVar = context->firstTempVar;
  local_168.randomizeDetails = context->randomizeDetails;
  pCVar2 = (syntax->predicate).ptr;
  if (pCVar2 == (ConditionalPredicateSyntax *)0x0) {
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,
               "T slang::not_null<slang::syntax::ConditionalPredicateSyntax *>::get() const [T = slang::syntax::ConditionalPredicateSyntax *]"
              );
  }
  uVar8 = (pCVar2->conditions).elements.size_ + 1;
  bVar6 = false;
  if (uVar8 < 2) {
    bVar16 = 1;
    bVar17 = 1;
    bVar15 = 0;
  }
  else {
    bVar17 = 1;
    local_188 = 
    "T slang::not_null<slang::syntax::PatternSyntax *>::get() const [T = slang::syntax::PatternSyntax *]"
    ;
    bVar15 = 0;
    bVar16 = 1;
    bVar6 = false;
    index = 0;
    do {
      pCVar9 = slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::
               operator[](&pCVar2->conditions,index);
      pEVar3 = (pCVar9->expr).ptr;
      if (pEVar3 == (ExpressionSyntax *)0x0) {
        assert::assertFailed
                  ("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                   ,0x26,
                   "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
                  );
      }
      pEVar12 = Expression::selfDetermined
                          (comp,pEVar3,&local_168,(bitmask<slang::ast::ASTFlags>)0x0);
      bVar4 = Expression::bad(pEVar12);
      bVar15 = bVar15 | bVar4;
      if (pCVar9->matchesClause == (MatchesClauseSyntax *)0x0) {
        pTVar18 = (pEVar12->type).ptr;
        if (pTVar18 == (Type *)0x0) {
          assert::assertFailed
                    ("ptr",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                     ,0x26,
                     "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
                    );
        }
        bVar4 = Type::isFourState(pTVar18);
        bVar6 = (bool)(bVar6 | bVar4);
        if ((bVar15 == 0) &&
           (bVar4 = ASTContext::requireBooleanConvertible(&local_168,pEVar12), !bVar4)) {
          bVar15 = 1;
        }
        piVar10 = (int *)0x0;
      }
      else {
        local_70 = &local_f0;
        local_68.
        super_StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>
        .storage = (StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>
                    *)&local_f0;
        local_68.entries =
             ska::detailv3::
             empty_default_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PatternVarSymbol_const*>>
                       ();
        local_68.num_slots_minus_one = 0;
        local_68.hash_policy.shift = '?';
        local_68.max_lookups = '\x03';
        local_68._max_load_factor = 0.5;
        local_68.num_elements = 0;
        this = (Pattern *)(pCVar9->matchesClause->pattern).ptr;
        if (this == (Pattern *)0x0) {
LAB_003acb50:
          assert::assertFailed
                    ("ptr",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                     ,0x26,local_188);
        }
        pTVar18 = (pEVar12->type).ptr;
        if (pTVar18 == (Type *)0x0) {
          local_188 = 
          "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]";
          goto LAB_003acb50;
        }
        iVar7 = Pattern::bind(this,(int)pTVar18,(sockaddr *)&local_f0,(socklen_t)&local_168);
        piVar10 = (int *)CONCAT44(extraout_var,iVar7);
        bVar15 = bVar15 | *piVar10 == 0;
        ska::detailv3::
        sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>_>
        ::~sherwood_v3_table(&local_68);
        bVar17 = 0;
      }
      if ((bVar15 == 0) && (bVar17 != 0)) {
        ASTContext::tryEval((ConstantValue *)&local_f0,&local_168,pEVar12);
        if (local_d0 == '\0') {
          bVar17 = 0;
        }
        else if ((local_d0 == '\x01') &&
                (pvVar11 = std::
                           get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                     ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                       *)&local_f0),
                (pvVar11->super_SVIntStorage).unknownFlag != false)) {
          bVar17 = 0;
        }
        else {
          bVar4 = ConstantValue::isTrue((ConstantValue *)&local_f0);
          if (!bVar4) {
            bVar16 = 0;
          }
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_f0);
      }
      local_f0._0_8_ = pEVar12;
      local_f0._8_8_ = piVar10;
      SmallVectorBase<slang::ast::ConditionalExpression::Condition>::
      emplace_back<slang::ast::ConditionalExpression::Condition>(&local_128,(Condition *)&local_f0);
      index = index + 1;
    } while (uVar8 >> 1 != index);
  }
  uVar14 = (ulong)((uint)(bVar17 & bVar16) * 2);
  uVar8 = (context->flags).m_bits & 0x1800;
  extraFlags_00.m_bits = uVar14 + 0x800;
  if (uVar8 != 0x1800) {
    extraFlags_00.m_bits = uVar14;
  }
  pEVar3 = (syntax->left).ptr;
  if (pEVar3 == (ExpressionSyntax *)0x0) {
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,
               "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
              );
  }
  uVar14 = 0;
  if (bVar17 != 0) {
    uVar14 = (ulong)(((byte)~bVar16 & 1) * 2);
  }
  extraFlags.m_bits = uVar14 + 0x800;
  if ((int)uVar8 != 0x1800) {
    extraFlags.m_bits = uVar14;
  }
  pEVar12 = Expression::create(comp,pEVar3,&local_168,extraFlags,assignmentTarget);
  pEVar3 = (syntax->right).ptr;
  if (pEVar3 == (ExpressionSyntax *)0x0) {
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,
               "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
              );
  }
  this_00 = Expression::create(comp,pEVar3,context,extraFlags_00,assignmentTarget);
  bVar4 = Expression::bad(pEVar12);
  bVar5 = true;
  if (!bVar4) {
    bVar5 = Expression::bad(this_00);
  }
  pTVar18 = (pEVar12->type).ptr;
  if (pTVar18 == (Type *)0x0) {
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,
               "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
              );
  }
  this_01 = (this_00->type).ptr;
  if (this_01 == (Type *)0x0) {
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,
               "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
              );
  }
  if (pTVar18->canonical == (Type *)0x0) {
    Type::resolveCanonical(pTVar18);
  }
  if ((pTVar18->canonical->super_Symbol).kind == UnboundedType) {
    pTVar18 = comp->intType;
  }
  if (this_01->canonical == (Type *)0x0) {
    Type::resolveCanonical(this_01);
  }
  if ((this_01->canonical->super_Symbol).kind == UnboundedType) {
    this_01 = comp->intType;
  }
  pTVar13 = Expression::binaryOperatorType(comp,pTVar18,this_01,bVar6,false);
  iVar7 = SmallVectorBase<slang::ast::ConditionalExpression::Condition>::copy
                    (&local_128,(EVP_PKEY_CTX *)comp,src);
  local_f0._0_8_ = CONCAT44(extraout_var_00,iVar7);
  local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  expr = BumpAllocator::
         emplace<slang::ast::ConditionalExpression,slang::ast::Type_const&,nonstd::span_lite::span<slang::ast::ConditionalExpression::Condition,18446744073709551615ul>,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange>
                   (&comp->super_BumpAllocator,pTVar13,
                    (span<slang::ast::ConditionalExpression::Condition,_18446744073709551615UL> *)
                    &local_f0,pEVar12,this_00,&local_40);
  if (bVar15 != 0 || bVar5 != false) {
    expr = (ConditionalExpression *)Expression::badExpr(comp,&expr->super_Expression);
    goto LAB_003ac9cd;
  }
  bVar6 = Type::isNumeric(pTVar18);
  if ((!bVar6) || (bVar6 = Type::isNumeric(this_01), !bVar6)) {
    if (pTVar18->canonical == (Type *)0x0) {
      Type::resolveCanonical(pTVar18);
    }
    if ((pTVar18->canonical->super_Symbol).kind == NullType) {
      if (this_01->canonical == (Type *)0x0) {
        Type::resolveCanonical(this_01);
      }
      if ((this_01->canonical->super_Symbol).kind != NullType) goto LAB_003ac81d;
      pTVar13 = Compilation::getNullType(comp);
    }
    else {
LAB_003ac81d:
      if (pTVar18->canonical == (Type *)0x0) {
        Type::resolveCanonical(pTVar18);
      }
      pTVar13 = pTVar18;
      if ((pTVar18->canonical->super_Symbol).kind != ClassType) {
        if (this_01->canonical == (Type *)0x0) {
          Type::resolveCanonical(this_01);
        }
        if ((this_01->canonical->super_Symbol).kind == ClassType) goto LAB_003ac92f;
        if (pTVar18->canonical == (Type *)0x0) {
          Type::resolveCanonical(pTVar18);
        }
        if ((pTVar18->canonical->super_Symbol).kind == CHandleType) goto LAB_003ac92f;
        if (this_01->canonical == (Type *)0x0) {
          Type::resolveCanonical(this_01);
        }
        if ((this_01->canonical->super_Symbol).kind == CHandleType) goto LAB_003ac92f;
        if (pTVar18->canonical == (Type *)0x0) {
          Type::resolveCanonical(pTVar18);
        }
        if ((pTVar18->canonical->super_Symbol).kind == EventType) goto LAB_003ac92f;
        if (this_01->canonical == (Type *)0x0) {
          Type::resolveCanonical(this_01);
        }
        if ((this_01->canonical->super_Symbol).kind == EventType) goto LAB_003ac92f;
        if (pTVar18->canonical == (Type *)0x0) {
          Type::resolveCanonical(pTVar18);
        }
        if ((pTVar18->canonical->super_Symbol).kind == VirtualInterfaceType) goto LAB_003ac92f;
        if (this_01->canonical == (Type *)0x0) {
          Type::resolveCanonical(this_01);
        }
        if ((this_01->canonical->super_Symbol).kind == VirtualInterfaceType) goto LAB_003ac92f;
        if (pTVar18->canonical == (Type *)0x0) {
          Type::resolveCanonical(pTVar18);
        }
        if ((pTVar18->canonical->super_Symbol).kind == CovergroupType) goto LAB_003ac92f;
        if (this_01->canonical == (Type *)0x0) {
          Type::resolveCanonical(this_01);
        }
        if ((this_01->canonical->super_Symbol).kind == CovergroupType) goto LAB_003ac92f;
        bVar6 = Type::isEquivalent(pTVar18,this_01);
        if (bVar6) {
          if (pTVar18->canonical == (Type *)0x0) {
            Type::resolveCanonical(pTVar18);
          }
          if ((pTVar18->canonical->super_Symbol).kind != UnpackedUnionType) goto LAB_003ac999;
        }
        bVar6 = Expression::isImplicitString(pEVar12);
        if ((bVar6) && (bVar6 = Expression::isImplicitString(this_00), bVar6)) {
          pTVar13 = comp->stringType;
          if (comp->stringType == (Type *)0x0) {
            assert::assertFailed
                      ("ptr",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                       ,0x1b,
                       "slang::not_null<const slang::ast::Type *>::not_null(U &&) [T = const slang::ast::Type *, U = const slang::ast::Type *]"
                      );
          }
          goto LAB_003ac999;
        }
LAB_003aca36:
        location = parsing::Token::location(&syntax->question);
        diag = ASTContext::addDiag(context,(DiagCode)0x200007,location);
        diag_00 = ast::operator<<(diag,pTVar18);
        ast::operator<<(diag_00,this_01);
        Diagnostic::operator<<(diag,pEVar12->sourceRange);
        Diagnostic::operator<<(diag,this_00->sourceRange);
        expr = (ConditionalExpression *)Expression::badExpr(comp,&expr->super_Expression);
        goto LAB_003ac9cd;
      }
LAB_003ac92f:
      if (pTVar18->canonical == (Type *)0x0) {
        Type::resolveCanonical(pTVar18);
      }
      if ((pTVar18->canonical->super_Symbol).kind == NullType) {
        pTVar13 = this_01;
        if (this_01 == (Type *)0x0) {
          assert::assertFailed
                    ("ptr",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                     ,0x1b,
                     "slang::not_null<const slang::ast::Type *>::not_null(U &&) [T = const slang::ast::Type *, U = const slang::ast::Type *&]"
                    );
        }
      }
      else {
        if (this_01->canonical == (Type *)0x0) {
          Type::resolveCanonical(this_01);
        }
        if (((((this_01->canonical->super_Symbol).kind != NullType) &&
             (bVar6 = Type::isAssignmentCompatible(this_01,pTVar18), pTVar13 = this_01, !bVar6)) &&
            (bVar6 = Type::isAssignmentCompatible(pTVar18,this_01), pTVar13 = pTVar18, !bVar6)) &&
           ((pTVar13 = Type::getCommonBase(pTVar18,this_01), pTVar13 == (Type *)0x0 &&
            (bVar6 = Type::isEquivalent(pTVar18,this_01), pTVar13 = pTVar18, !bVar6))))
        goto LAB_003aca36;
      }
    }
LAB_003ac999:
    (expr->super_Expression).type.ptr = pTVar13;
  }
  psVar1 = &(syntax->attributes).
            super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>;
  syntax_00.data_ = psVar1->data_;
  syntax_00.size_ = psVar1->size_;
  if ((syntax->attributes).
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ != 0 &&
      psVar1->data_ == (pointer)0x0) {
    std::terminate();
  }
  ASTContext::setAttributes(context,&expr->super_Expression,syntax_00);
LAB_003ac9cd:
  if (local_128.data_ != (pointer)local_128.firstElement) {
    free(local_128.data_);
  }
  return &expr->super_Expression;
}

Assistant:

Expression& ConditionalExpression::fromSyntax(Compilation& comp,
                                              const ConditionalExpressionSyntax& syntax,
                                              const ASTContext& context,
                                              const Type* assignmentTarget) {
    bool bad = false;
    bool isConst = true;
    bool isTrue = true;
    bool isFourState = false;
    SmallVector<Condition> conditions;
    ASTContext trueContext = context;

    for (auto condSyntax : syntax.predicate->conditions) {
        auto& cond = selfDetermined(comp, *condSyntax->expr, trueContext);
        bad |= cond.bad();

        const Pattern* pattern = nullptr;
        if (condSyntax->matchesClause) {
            Pattern::VarMap patternVarMap;
            pattern = &Pattern::bind(*condSyntax->matchesClause->pattern, *cond.type, patternVarMap,
                                     trueContext);

            // We don't consider the condition to be const if there's a pattern.
            isConst = false;
            bad |= pattern->bad();
        }
        else {
            isFourState |= cond.type->isFourState();
            if (!bad && !trueContext.requireBooleanConvertible(cond))
                bad = true;
        }

        if (!bad && isConst) {
            ConstantValue condVal = trueContext.tryEval(cond);
            if (!condVal || (condVal.isInteger() && condVal.integer().hasUnknown()))
                isConst = false;
            else if (!condVal.isTrue())
                isTrue = false;
        }

        conditions.push_back({&cond, pattern});
    }

    // If the predicate is known at compile time, we can tell which branch will be unevaluated.
    bitmask<ASTFlags> leftFlags = ASTFlags::None;
    bitmask<ASTFlags> rightFlags = ASTFlags::None;
    if (isConst) {
        if (isTrue)
            rightFlags = ASTFlags::UnevaluatedBranch;
        else
            leftFlags = ASTFlags::UnevaluatedBranch;
    }

    // Pass through the flag allowing unbounded literals.
    if (context.flags.has(ASTFlags::AllowUnboundedLiteral) &&
        context.flags.has(ASTFlags::AllowUnboundedLiteralArithmetic)) {
        leftFlags |= ASTFlags::AllowUnboundedLiteral;
        rightFlags |= ASTFlags::AllowUnboundedLiteral;
    }

    auto& left = create(comp, *syntax.left, trueContext, leftFlags, assignmentTarget);
    auto& right = create(comp, *syntax.right, context, rightFlags, assignmentTarget);
    bad |= left.bad() || right.bad();

    const Type* lt = left.type;
    const Type* rt = right.type;
    if (lt->isUnbounded())
        lt = &comp.getIntType();
    if (rt->isUnbounded())
        rt = &comp.getIntType();

    // Force four-state return type for ambiguous condition case.
    const Type* resultType = binaryOperatorType(comp, lt, rt, isFourState);
    auto result = comp.emplace<ConditionalExpression>(*resultType, conditions.copy(comp), left,
                                                      right, syntax.sourceRange());
    if (bad)
        return badExpr(comp, result);

    // If both sides of the expression are numeric, we've already determined the correct
    // result type. Otherwise, follow the rules in [11.14.11].
    bool good = true;
    if (!lt->isNumeric() || !rt->isNumeric()) {
        if (lt->isNull() && rt->isNull()) {
            result->type = &comp.getNullType();
        }
        else if (lt->isClass() || rt->isClass() || lt->isCHandle() || rt->isCHandle() ||
                 lt->isEvent() || rt->isEvent() || lt->isVirtualInterface() ||
                 rt->isVirtualInterface() || lt->isCovergroup() || rt->isCovergroup()) {
            if (lt->isNull())
                result->type = rt;
            else if (rt->isNull())
                result->type = lt;
            else if (rt->isAssignmentCompatible(*lt))
                result->type = rt;
            else if (lt->isAssignmentCompatible(*rt))
                result->type = lt;
            else if (auto common = Type::getCommonBase(*lt, *rt))
                result->type = common;
            else if (lt->isEquivalent(*rt))
                result->type = lt;
            else
                good = false;
        }
        else if (lt->isEquivalent(*rt) && !lt->isUnpackedUnion()) {
            result->type = lt;
        }
        else if (left.isImplicitString() && right.isImplicitString()) {
            result->type = &comp.getStringType();
        }
        else {
            good = false;
        }
    }

    if (!good) {
        auto& diag = context.addDiag(diag::BadConditionalExpression, syntax.question.location());
        diag << *lt << *rt;
        diag << left.sourceRange;
        diag << right.sourceRange;
        return badExpr(comp, result);
    }

    context.setAttributes(*result, syntax.attributes);
    return *result;
}